

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O0

bool __thiscall
ZAP::ArchiveBuilder::buildMemory
          (ArchiveBuilder *this,char **data,size_t *size,Compression compression)

{
  ulong uVar1;
  void *pvVar2;
  undefined1 local_1d8 [2] [16];
  stringstream local_1b8 [8];
  stringstream stream;
  ostream local_1a8 [380];
  Compression local_2c;
  size_t *psStack_28;
  Compression compression_local;
  size_t *size_local;
  char **data_local;
  ArchiveBuilder *this_local;
  
  local_2c = compression;
  psStack_28 = size;
  size_local = (size_t *)data;
  data_local = (char **)this;
  std::__cxx11::stringstream::stringstream(local_1b8,_S_bin);
  this_local._7_1_ = build(this,local_1a8,local_2c);
  if ((bool)this_local._7_1_) {
    std::istream::seekg((long)local_1b8,_S_beg);
    local_1d8[0] = std::istream::tellg();
    uVar1 = std::fpos::operator_cast_to_long((fpos *)local_1d8);
    *psStack_28 = uVar1;
    std::istream::seekg((long)local_1b8,_S_beg);
    pvVar2 = operator_new__(*psStack_28);
    *size_local = (size_t)pvVar2;
    std::istream::read((char *)local_1b8,*size_local);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ArchiveBuilder::buildMemory(char *&data, std::size_t &size, Compression compression)
	{
		std::stringstream stream(std::ios::binary);
		if (build(stream, compression))
		{
			stream.seekg(0, std::ios::end);
			size = static_cast<std::size_t>(stream.tellg());
			stream.seekg(0, std::ios::beg);

			data = new char[size];
			stream.read(data, size);

			return true;
		}
		return false;
	}